

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall kj::anon_unknown_31::WebSocketImpl::close(WebSocketImpl *this,int __fd)

{
  size_t sVar1;
  uchar *puVar2;
  char *__src;
  short in_DX;
  ArrayPtr<const_unsigned_char> AVar3;
  undefined1 local_88 [8];
  Promise<void> promise;
  Fault f;
  Array<unsigned_char> payload;
  uint16_t code_local;
  WebSocketImpl *this_local;
  StringPtr reason_local;
  
  reason_local.content.size_ = (size_t)this;
  Array<unsigned_char>::Array((Array<unsigned_char> *)&f);
  if (in_DX == 0x3ed) {
    sVar1 = StringPtr::size((StringPtr *)&this_local);
    if (sVar1 != 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47]>
                ((Fault *)&stack0xffffffffffffffb0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x7da,FAILED,"reason.size() == 0",
                 "\"WebSocket close code 1005 cannot have a reason\"",
                 (char (*) [47])"WebSocket close code 1005 cannot have a reason");
      _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffb0);
    }
  }
  else {
    sVar1 = StringPtr::size((StringPtr *)&this_local);
    heapArray<unsigned_char>((Array<unsigned_char> *)&promise.super_PromiseBase.node.ptr,sVar1 + 2);
    Array<unsigned_char>::operator=
              ((Array<unsigned_char> *)&f,
               (Array<unsigned_char> *)&promise.super_PromiseBase.node.ptr);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&promise.super_PromiseBase.node.ptr);
    payload.disposer._7_1_ = (uchar)((ushort)in_DX >> 8);
    puVar2 = Array<unsigned_char>::operator[]((Array<unsigned_char> *)&f,0);
    *puVar2 = payload.disposer._7_1_;
    payload.disposer._6_1_ = (uchar)in_DX;
    puVar2 = Array<unsigned_char>::operator[]((Array<unsigned_char> *)&f,1);
    *puVar2 = payload.disposer._6_1_;
    puVar2 = Array<unsigned_char>::begin((Array<unsigned_char> *)&f);
    __src = StringPtr::begin((StringPtr *)&this_local);
    sVar1 = StringPtr::size((StringPtr *)&this_local);
    memcpy(puVar2 + 2,__src,sVar1);
  }
  AVar3 = kj::Array::operator_cast_to_ArrayPtr((Array *)&f);
  AVar3.size_ = (size_t)AVar3.ptr;
  AVar3.ptr = (uchar *)0x8;
  sendImpl((WebSocketImpl *)local_88,(byte)__fd,AVar3);
  mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)&f);
  Promise<void>::attach<kj::Array<unsigned_char>>
            ((Promise<void> *)this,(Array<unsigned_char> *)local_88);
  Promise<void>::~Promise((Promise<void> *)local_88);
  Array<unsigned_char>::~Array((Array<unsigned_char> *)&f);
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
    kj::Array<byte> payload;
    if (code == 1005) {
      KJ_REQUIRE(reason.size() == 0, "WebSocket close code 1005 cannot have a reason");

      // code 1005 -- leave payload empty
    } else {
      payload = heapArray<byte>(reason.size() + 2);
      payload[0] = code >> 8;
      payload[1] = code;
      memcpy(payload.begin() + 2, reason.begin(), reason.size());
    }

    auto promise = sendImpl(OPCODE_CLOSE, payload);
    return promise.attach(kj::mv(payload));
  }